

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# konvert.h
# Opt level: O2

double konvert::atof(char *__nptr)

{
  ulong uVar1;
  ulong uVar2;
  int *piVar3;
  uint uVar4;
  uint uVar5;
  long lVar6;
  double dVar7;
  double dVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined4 uVar14;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  
  uVar2 = (ulong)(*__nptr == '-');
  dVar7 = *(double *)(&DAT_00102030 + uVar2 * 8);
  uVar1 = (long)__nptr[uVar2] - 0x30;
  if (uVar1 < 10) {
    piVar3 = (int *)(__nptr + uVar2 + 2);
    while( true ) {
      uVar4 = *(int *)((long)piVar3 + -1) + 0xcfcfcfd0;
      uVar5 = uVar4 & 0xff;
      if (9 < uVar5) break;
      uVar1 = (ulong)uVar5 + uVar1 * 10;
      uVar5 = uVar4 >> 8 & 0xff;
      if (9 < uVar5) {
        if (uVar5 != 0xfe) goto LAB_0010141f;
        piVar3 = (int *)((long)piVar3 + 1);
        goto LAB_00101374;
      }
      uVar1 = (ulong)uVar5 + uVar1 * 10;
      uVar5 = uVar4 >> 0x10 & 0xff;
      if (9 < uVar5) {
        if (uVar5 != 0xfe) goto LAB_0010141f;
        piVar3 = (int *)((long)piVar3 + 2);
        goto LAB_00101374;
      }
      uVar1 = (ulong)uVar5 + uVar1 * 10;
      if (0x9ffffff < uVar4) {
        if (uVar4 >> 0x18 != 0xfe) goto LAB_0010141f;
        piVar3 = (int *)((long)piVar3 + 3);
        goto LAB_00101374;
      }
      uVar1 = uVar1 * 10 + (ulong)(uVar4 >> 0x18);
      piVar3 = piVar3 + 1;
    }
    if (uVar5 != 0xfe) {
LAB_0010141f:
      auVar9._8_4_ = (int)(uVar1 >> 0x20);
      auVar9._0_8_ = uVar1;
      auVar9._12_4_ = 0x45300000;
      return dVar7 * ((auVar9._8_8_ - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0));
    }
  }
  else {
    if (uVar1 != 0xfffffffffffffffe) {
      dVar7 = nan("nan");
      return dVar7;
    }
    piVar3 = (int *)(__nptr + uVar2 + 1);
    uVar1 = 0;
  }
LAB_00101374:
  lVar6 = 0;
  dVar8 = dVar7;
  while( true ) {
    uVar4 = *piVar3 + 0xcfcfcfd0;
    uVar14 = (undefined4)(uVar1 >> 0x20);
    if (9 < (uVar4 & 0xfe)) {
      auVar11._8_4_ = (int)((ulong)lVar6 >> 0x20);
      auVar11._0_8_ = lVar6;
      auVar11._12_4_ = 0x45300000;
      auVar12._8_4_ = uVar14;
      auVar12._0_8_ = uVar1;
      auVar12._12_4_ = 0x45300000;
      return dVar8 * ((auVar11._8_8_ - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)lVar6) - 4503599627370496.0)) +
             dVar7 * ((auVar12._8_8_ - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0));
    }
    lVar6 = (ulong)(uVar4 & 0xff) + lVar6 * 10;
    if (0x9ff < (uVar4 & 0xfe00)) break;
    lVar6 = (ulong)(uVar4 >> 8 & 0xff) + lVar6 * 10;
    if (0x9ffff < (uVar4 & 0xfe0000)) {
      dVar8 = dVar8 * 0.01;
      goto LAB_001014b9;
    }
    lVar6 = (ulong)(uVar4 >> 0x10 & 0xff) + lVar6 * 10;
    if (0x9ffffff < uVar4) {
      dVar8 = dVar8 * 0.001;
      goto LAB_001014b9;
    }
    piVar3 = piVar3 + 1;
    lVar6 = lVar6 * 10 + (ulong)(uVar4 >> 0x18);
    dVar8 = dVar8 * 0.0001;
  }
  dVar8 = dVar8 * 0.1;
LAB_001014b9:
  auVar13._8_4_ = (int)((ulong)lVar6 >> 0x20);
  auVar13._0_8_ = lVar6;
  auVar13._12_4_ = 0x45300000;
  auVar10._8_4_ = uVar14;
  auVar10._0_8_ = uVar1;
  auVar10._12_4_ = 0x45300000;
  return dVar7 * ((auVar10._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) +
         ((auVar13._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)lVar6) - 4503599627370496.0)) * dVar8;
}

Assistant:

inline double atof(const char *input){
    unsigned char rbuf[4];
    uint32_t *buf_ptr = (uint32_t *)rbuf;

    double frac = 1.0;
    if(*input == '-'){ frac = -1.0; input++; }

    unsigned long int_res = 0;
    unsigned long frac_res = 0;

    double sign = frac;
    uint32_t *input_ptr = (uint32_t *)(input + 1);

    if((int_res = (*input - '0')) <= 9) {
      while(true) {
        *buf_ptr = *input_ptr++ - 0x30303030;

        if( rbuf[0] <= 9 ) int_res = int_res*10 + rbuf[0];
        else if(rbuf[0] == 254) {input = ((char *)input_ptr - 3); break;}
        else return frac * int_res;

        if( rbuf[1] <= 9 ) int_res = int_res*10 + rbuf[1];
        else if(rbuf[1] == 254) {input = ((char *)input_ptr - 2); break;}
        else return frac * int_res;

        if( rbuf[2] <= 9 ) int_res = int_res*10 + rbuf[2];
        else if(rbuf[2] == 254) {input = ((char *)input_ptr - 1); break;}
        else return frac * int_res;

        if( rbuf[3] <= 9 ) int_res = int_res*10 + rbuf[3];
        else if(rbuf[3] == 254) {input = ((char *)input_ptr - 0); break;}
        else return frac * int_res;
      }
    }
    else if(int_res == (unsigned long)-2){ input++; int_res = 0; }
    else return nan("nan");


    input_ptr = (uint32_t *)(input);
    while(true){
      *buf_ptr = *input_ptr++ - 0x30303030;
      if( rbuf[0] <= 9 ) frac_res = frac_res*10 + rbuf[0]; else return (frac     * frac_res + int_res * sign);
      if( rbuf[1] <= 9 ) frac_res = frac_res*10 + rbuf[1]; else return (frac * .1 * frac_res + int_res * sign);
      if( rbuf[2] <= 9 ) frac_res = frac_res*10 + rbuf[2]; else return (frac * .01 * frac_res + int_res * sign);
      if( rbuf[3] <= 9 ) frac_res = frac_res*10 + rbuf[3]; else return (frac * .001 * frac_res + int_res * sign);
      frac *= .0001;
    }
  }